

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

InstanceSideEffects * __thiscall
slang::ast::Compilation::getOrAddSideEffects(Compilation *this,Symbol *instanceBody)

{
  flat_hash_map<const_Symbol_*,_std::unique_ptr<InstanceSideEffects>_> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  pointer __p;
  ulong pos0;
  _Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false> _Var8;
  _Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false> _Var9;
  ulong hash;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
  *this_00;
  uint uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  locator res;
  try_emplace_args_t local_69;
  Symbol *local_68;
  locator local_60;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  arrays_ = &this->instanceSideEffectMap;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = instanceBody;
  hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->instanceSideEffectMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar4 = (this->instanceSideEffectMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
           .arrays.elements_;
  uVar5 = (this->instanceSideEffectMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
          .arrays.groups_size_mask;
  uVar10 = 0;
  uVar12 = pos0;
  do {
    pgVar2 = (this->instanceSideEffectMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
             .arrays.groups_ + uVar12;
    local_48 = pgVar2->m[0].n;
    uStack_47 = pgVar2->m[1].n;
    uStack_46 = pgVar2->m[2].n;
    bStack_45 = pgVar2->m[3].n;
    uStack_44 = pgVar2->m[4].n;
    uStack_43 = pgVar2->m[5].n;
    uStack_42 = pgVar2->m[6].n;
    bStack_41 = pgVar2->m[7].n;
    uStack_40 = pgVar2->m[8].n;
    uStack_3f = pgVar2->m[9].n;
    uStack_3e = pgVar2->m[10].n;
    bStack_3d = pgVar2->m[0xb].n;
    uStack_3c = pgVar2->m[0xc].n;
    uStack_3b = pgVar2->m[0xd].n;
    uStack_3a = pgVar2->m[0xe].n;
    bStack_39 = pgVar2->m[0xf].n;
    uVar14 = (uchar)uVar3;
    auVar18[0] = -(local_48 == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 8);
    auVar18[1] = -(uStack_47 == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 0x10);
    auVar18[2] = -(uStack_46 == uVar16);
    bVar17 = (byte)((uint)uVar3 >> 0x18);
    auVar18[3] = -(bStack_45 == bVar17);
    auVar18[4] = -(uStack_44 == uVar14);
    auVar18[5] = -(uStack_43 == uVar15);
    auVar18[6] = -(uStack_42 == uVar16);
    auVar18[7] = -(bStack_41 == bVar17);
    auVar18[8] = -(uStack_40 == uVar14);
    auVar18[9] = -(uStack_3f == uVar15);
    auVar18[10] = -(uStack_3e == uVar16);
    auVar18[0xb] = -(bStack_3d == bVar17);
    auVar18[0xc] = -(uStack_3c == uVar14);
    auVar18[0xd] = -(uStack_3b == uVar15);
    auVar18[0xe] = -(uStack_3a == uVar16);
    auVar18[0xf] = -(bStack_39 == bVar17);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
        local_68 = instanceBody, uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
      iVar6 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (*(Symbol **)((long)&ppVar4[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4)) ==
          instanceBody) {
        local_60.p = (pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>
                      *)((long)&ppVar4[uVar12 * 0xf].first + (ulong)(uint)(iVar6 << 4));
        goto LAB_00361d84;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
    lVar11 = uVar12 + uVar10;
    uVar10 = uVar10 + 1;
    uVar12 = lVar11 + 1U & uVar5;
  } while (uVar10 <= uVar5);
  if ((this->instanceSideEffectMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
      .size_ctrl.size <
      (this->instanceSideEffectMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*>
              (&local_60,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
                *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_69,&local_68);
    psVar1 = &(this->instanceSideEffectMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*>
              (&local_60,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,std::default_delete<slang::ast::Compilation::InstanceSideEffects>>>>>
                *)arrays_,hash,&local_69,&local_68);
  }
LAB_00361d84:
  _Var9._M_head_impl =
       ((local_60.p)->second)._M_t.
       super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
       ._M_t.
       super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
       .super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>._M_head_impl;
  if (_Var9._M_head_impl == (InstanceSideEffects *)0x0) {
    this_00 = &(local_60.p)->second;
    _Var8._M_head_impl = (InstanceSideEffects *)operator_new(0x38);
    *(undefined1 (*) [16])&(_Var8._M_head_impl)->ifacePortDrivers = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&(_Var8._M_head_impl)->ifacePortDrivers + 0x10) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&(_Var8._M_head_impl)->upwardNames + 8) = (undefined1  [16])0x0;
    *(undefined8 *)&(_Var8._M_head_impl)->cannotCache = 0;
    local_60.pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
    _Var9._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
         ._M_t.
         super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
         .super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
    ._M_t.
    super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
    .super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>._M_head_impl =
         _Var8._M_head_impl;
    if ((_Var9._M_head_impl != (InstanceSideEffects *)0x0) &&
       (std::default_delete<slang::ast::Compilation::InstanceSideEffects>::operator()
                  ((default_delete<slang::ast::Compilation::InstanceSideEffects> *)this_00,
                   _Var9._M_head_impl),
       (InstanceSideEffects *)local_60.pg != (InstanceSideEffects *)0x0)) {
      std::default_delete<slang::ast::Compilation::InstanceSideEffects>::operator()
                ((default_delete<slang::ast::Compilation::InstanceSideEffects> *)&local_60,
                 (InstanceSideEffects *)local_60.pg);
    }
    _Var9._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
         ._M_t.
         super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
         .super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>._M_head_impl;
  }
  return _Var9._M_head_impl;
}

Assistant:

Compilation::InstanceSideEffects& Compilation::getOrAddSideEffects(const Symbol& instanceBody) {
    auto& entry = instanceSideEffectMap[&instanceBody];
    if (!entry)
        entry = std::make_unique<InstanceSideEffects>();
    return *entry;
}